

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O0

int LZWDecodeCompat(TIFF *tif,uint8_t *op0,tmsize_t occ0,uint16_t s)

{
  uchar uVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  code_t *pcVar6;
  bool local_b5;
  ulong local_b0;
  uint64_t dec_bitsleft;
  tmsize_t residue;
  code_t *oldcodep;
  code_t *maxcodep;
  code_t *free_entp;
  code_t *codep;
  WordType nextdata;
  long nbitsmask;
  long nextbits;
  uint local_60;
  int len;
  int nbits;
  int code;
  uint8_t *bp;
  uint8_t *tp;
  tmsize_t occ;
  uint8_t *op;
  LZWCodecState *sp;
  uint16_t s_local;
  tmsize_t occ0_local;
  uint8_t *op0_local;
  TIFF *tif_local;
  
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                  ,0x32f,"int LZWDecodeCompat(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  tp = (uint8_t *)occ0;
  occ = (tmsize_t)op0;
  if (*(long *)(puVar2 + 0xa8) != 0) {
    free_entp = *(code_t **)(puVar2 + 200);
    dec_bitsleft = (ulong)free_entp->length - *(long *)(puVar2 + 0xa8);
    if (occ0 < (long)dec_bitsleft) {
      *(tmsize_t *)(puVar2 + 0xa8) = occ0 + *(long *)(puVar2 + 0xa8);
      do {
        free_entp = free_entp->next;
        dec_bitsleft = dec_bitsleft - 1;
      } while (occ0 < (long)dec_bitsleft);
      bp = op0 + occ0;
      do {
        bp[-1] = free_entp->value;
        free_entp = free_entp->next;
        tp = tp + -1;
        bp = bp + -1;
      } while (tp != (uint8_t *)0x0);
      return 1;
    }
    occ = (tmsize_t)(op0 + dec_bitsleft);
    tp = (uint8_t *)(occ0 - dec_bitsleft);
    bp = (uint8_t *)occ;
    do {
      bp[-1] = free_entp->value;
      free_entp = free_entp->next;
      dec_bitsleft = dec_bitsleft - 1;
      bp = bp + -1;
    } while (dec_bitsleft != 0);
    puVar2[0xa8] = '\0';
    puVar2[0xa9] = '\0';
    puVar2[0xaa] = '\0';
    puVar2[0xab] = '\0';
    puVar2[0xac] = '\0';
    puVar2[0xad] = '\0';
    puVar2[0xae] = '\0';
    puVar2[0xaf] = '\0';
  }
  _nbits = tif->tif_rawcp;
  *(tmsize_t *)(puVar2 + 0xb0) =
       (tif->tif_rawcc - *(long *)(puVar2 + 0xb8)) * 8 + *(long *)(puVar2 + 0xb0);
  local_b0 = *(ulong *)(puVar2 + 0xb0);
  local_60 = (uint)*(ushort *)(puVar2 + 0x80);
  codep = *(code_t **)(puVar2 + 0x88);
  nbitsmask = *(long *)(puVar2 + 0x90);
  nextdata = *(WordType *)(puVar2 + 0xa0);
  maxcodep = *(code_t **)(puVar2 + 0xd8);
  oldcodep = *(code_t **)(puVar2 + 0xe0);
  residue = *(tmsize_t *)(puVar2 + 0xd0);
LAB_003e99ba:
  do {
    if ((long)tp < 1) goto LAB_003ea032;
    if (local_b0 < (ulong)(long)(int)local_60) {
      TIFFWarningExtR(tif,"LZWDecodeCompat","LZWDecode: Strip %u not terminated with EOI code",
                      (ulong)tif->tif_curstrip);
      len = 0x101;
    }
    else {
      codep = (code_t *)((ulong)*_nbits << ((byte)nbitsmask & 0x3f) | (ulong)codep);
      lVar5 = nbitsmask + 8;
      pbVar3 = _nbits + 1;
      if (lVar5 < (int)local_60) {
        codep = (code_t *)((ulong)_nbits[1] << ((byte)lVar5 & 0x3f) | (ulong)codep);
        lVar5 = nbitsmask + 0x10;
        pbVar3 = _nbits + 2;
      }
      _nbits = pbVar3;
      nbitsmask = lVar5;
      len = (int)(ushort)((ushort)codep & (ushort)nextdata);
      codep = (code_t *)((ulong)codep >> ((byte)local_60 & 0x3f));
      nbitsmask = nbitsmask - (int)local_60;
      local_b0 = local_b0 - (long)(int)local_60;
    }
    if (len == 0x101) goto LAB_003ea032;
    if (len != 0x100) {
      pcVar6 = (code_t *)(*(long *)(puVar2 + 0xe8) + (long)len * 0x10);
      if ((maxcodep < *(code_t **)(puVar2 + 0xe8)) ||
         ((code_t *)(*(long *)(puVar2 + 0xe8) + 0x13ff0U) <= maxcodep)) {
        TIFFErrorExtR(tif,"LZWDecodeCompat","Corrupted LZW table at scanline %u",(ulong)tif->tif_row
                     );
        return 0;
      }
      maxcodep->next = (code_ent *)residue;
      if ((maxcodep->next < *(code_ent **)(puVar2 + 0xe8)) ||
         ((code_ent *)(*(long *)(puVar2 + 0xe8) + 0x13ff0U) <= maxcodep->next)) {
        TIFFErrorExtR(tif,"LZWDecodeCompat","Corrupted LZW table at scanline %u",(ulong)tif->tif_row
                     );
        return 0;
      }
      maxcodep->firstchar = maxcodep->next->firstchar;
      maxcodep->length = maxcodep->next->length + 1;
      if (pcVar6 < maxcodep) {
        uVar1 = pcVar6->firstchar;
      }
      else {
        uVar1 = maxcodep->firstchar;
      }
      maxcodep->value = uVar1;
      maxcodep = maxcodep + 1;
      if (oldcodep < maxcodep) {
        local_60 = local_60 + 1;
        if (0xc < (int)local_60) {
          local_60 = 0xc;
        }
        nextdata = (1L << ((byte)local_60 & 0x3f)) - 1;
        oldcodep = (code_t *)(*(long *)(puVar2 + 0xe8) + nextdata * 0x10);
      }
      residue = (tmsize_t)pcVar6;
      if ((uint)len < 0x100) {
        *(char *)occ = (char)len;
        tp = tp + -1;
        occ = occ + 1;
        goto LAB_003e99ba;
      }
      if (pcVar6->length == 0) {
        TIFFErrorExtR(tif,"LZWDecodeCompat",
                      "Wrong length of decoded string: data probably corrupted at scanline %u",
                      (ulong)tif->tif_row);
        return 0;
      }
      free_entp = pcVar6;
      if ((long)(ulong)pcVar6->length <= (long)tp) {
        uVar4 = (uint)pcVar6->length;
        bp = (uint8_t *)(occ + (int)uVar4);
        do {
          bp[-1] = free_entp->value;
          free_entp = free_entp->next;
          local_b5 = free_entp != (code_ent *)0x0 && (ulong)occ < bp + -1;
          bp = bp + -1;
        } while (local_b5);
        if ((long)tp < (long)(int)uVar4) {
          __assert_fail("occ >= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                        ,0x3d9,"int LZWDecodeCompat(TIFF *, uint8_t *, tmsize_t, uint16_t)");
        }
        tp = tp + -(long)(int)uVar4;
        occ = occ + (int)uVar4;
        goto LAB_003e99ba;
      }
      *(code_t **)(puVar2 + 200) = pcVar6;
      do {
        free_entp = free_entp->next;
      } while ((long)tp < (long)(ulong)free_entp->length);
      *(uint8_t **)(puVar2 + 0xa8) = tp;
      bp = tp + occ;
      do {
        bp[-1] = free_entp->value;
        free_entp = free_entp->next;
        tp = tp + -1;
        bp = bp + -1;
      } while (tp != (uint8_t *)0x0);
      tp = (uint8_t *)0x0;
LAB_003ea032:
      tif->tif_rawcc = tif->tif_rawcc - ((long)_nbits - (long)tif->tif_rawcp);
      tif->tif_rawcp = _nbits;
      *(tmsize_t *)(puVar2 + 0xb8) = tif->tif_rawcc;
      *(ulong *)(puVar2 + 0xb0) = local_b0;
      *(short *)(puVar2 + 0x80) = (short)local_60;
      *(code_t **)(puVar2 + 0x88) = codep;
      *(long *)(puVar2 + 0x90) = nbitsmask;
      *(WordType *)(puVar2 + 0xa0) = nextdata;
      *(tmsize_t *)(puVar2 + 0xd0) = residue;
      *(code_t **)(puVar2 + 0xd8) = maxcodep;
      *(code_t **)(puVar2 + 0xe0) = oldcodep;
      if (0 < (long)tp) {
        TIFFErrorExtR(tif,"LZWDecodeCompat","Not enough data at scanline %u (short %lu bytes)",
                      (ulong)tif->tif_row,tp);
        return 0;
      }
      return 1;
    }
    do {
      maxcodep = (code_t *)(*(long *)(puVar2 + 0xe8) + 0x1020);
      _TIFFmemset(maxcodep,0,0x12fd0);
      local_60 = 9;
      nextdata = 0x1ff;
      oldcodep = (code_t *)(*(long *)(puVar2 + 0xe8) + 0x1ff0);
      if (local_b0 < 9) {
        TIFFWarningExtR(tif,"LZWDecodeCompat","LZWDecode: Strip %u not terminated with EOI code",
                        (ulong)tif->tif_curstrip);
        len = 0x101;
      }
      else {
        codep = (code_t *)((ulong)*_nbits << ((byte)nbitsmask & 0x3f) | (ulong)codep);
        lVar5 = nbitsmask + 8;
        pbVar3 = _nbits + 1;
        if (lVar5 < 9) {
          codep = (code_t *)((ulong)_nbits[1] << ((byte)lVar5 & 0x3f) | (ulong)codep);
          lVar5 = nbitsmask + 0x10;
          pbVar3 = _nbits + 2;
        }
        _nbits = pbVar3;
        nbitsmask = lVar5;
        len = (int)((ushort)codep & 0x1ff);
        codep = (code_t *)((ulong)codep >> 9);
        nbitsmask = nbitsmask + -9;
        local_b0 = local_b0 - 9;
      }
    } while (len == 0x100);
    if (len == 0x101) goto LAB_003ea032;
    if (0x100 < (uint)len) {
      TIFFErrorExtR(tif,tif->tif_name,"LZWDecode: Corrupted LZW table at scanline %u",
                    (ulong)tif->tif_row);
      return 0;
    }
    *(char *)occ = (char)len;
    tp = tp + -1;
    residue = *(long *)(puVar2 + 0xe8) + (long)len * 0x10;
    occ = occ + 1;
  } while( true );
}

Assistant:

static int LZWDecodeCompat(TIFF *tif, uint8_t *op0, tmsize_t occ0, uint16_t s)
{
    static const char module[] = "LZWDecodeCompat";
    LZWCodecState *sp = DecoderState(tif);
    uint8_t *op = (uint8_t *)op0;
    tmsize_t occ = occ0;
    uint8_t *tp;
    uint8_t *bp;
    int code, nbits;
    int len;
    long nextbits, nbitsmask;
    WordType nextdata;
    code_t *codep, *free_entp, *maxcodep, *oldcodep;

    (void)s;
    assert(sp != NULL);

    /*
     * Restart interrupted output operation.
     */
    if (sp->dec_restart)
    {
        tmsize_t residue;

        codep = sp->dec_codep;
        residue = codep->length - sp->dec_restart;
        if (residue > occ)
        {
            /*
             * Residue from previous decode is sufficient
             * to satisfy decode request.  Skip to the
             * start of the decoded string, place decoded
             * values in the output buffer, and return.
             */
            sp->dec_restart += occ;
            do
            {
                codep = codep->next;
            } while (--residue > occ);
            tp = op + occ;
            do
            {
                *--tp = codep->value;
                codep = codep->next;
            } while (--occ);
            return (1);
        }
        /*
         * Residue satisfies only part of the decode request.
         */
        op += residue;
        occ -= residue;
        tp = op;
        do
        {
            *--tp = codep->value;
            codep = codep->next;
        } while (--residue);
        sp->dec_restart = 0;
    }

    bp = (uint8_t *)tif->tif_rawcp;

    sp->dec_bitsleft += (((uint64_t)tif->tif_rawcc - sp->old_tif_rawcc) << 3);
    uint64_t dec_bitsleft = sp->dec_bitsleft;

    nbits = sp->lzw_nbits;
    nextdata = sp->lzw_nextdata;
    nextbits = sp->lzw_nextbits;
    nbitsmask = sp->dec_nbitsmask;
    oldcodep = sp->dec_oldcodep;
    free_entp = sp->dec_free_entp;
    maxcodep = sp->dec_maxcodep;

    while (occ > 0)
    {
        NextCode(tif, sp, bp, code, GetNextCodeCompat, dec_bitsleft);
        if (code == CODE_EOI)
            break;
        if (code == CODE_CLEAR)
        {
            do
            {
                free_entp = sp->dec_codetab + CODE_FIRST;
                _TIFFmemset(free_entp, 0,
                            (CSIZE - CODE_FIRST) * sizeof(code_t));
                nbits = BITS_MIN;
                nbitsmask = MAXCODE(BITS_MIN);
                maxcodep = sp->dec_codetab + nbitsmask;
                NextCode(tif, sp, bp, code, GetNextCodeCompat, dec_bitsleft);
            } while (code == CODE_CLEAR); /* consecutive CODE_CLEAR codes */
            if (code == CODE_EOI)
                break;
            if (code > CODE_CLEAR)
            {
                TIFFErrorExtR(
                    tif, tif->tif_name,
                    "LZWDecode: Corrupted LZW table at scanline %" PRIu32,
                    tif->tif_row);
                return (0);
            }
            *op++ = (uint8_t)code;
            occ--;
            oldcodep = sp->dec_codetab + code;
            continue;
        }
        codep = sp->dec_codetab + code;

        /*
         * Add the new entry to the code table.
         */
        if (free_entp < &sp->dec_codetab[0] ||
            free_entp >= &sp->dec_codetab[CSIZE])
        {
            TIFFErrorExtR(tif, module,
                          "Corrupted LZW table at scanline %" PRIu32,
                          tif->tif_row);
            return (0);
        }

        free_entp->next = oldcodep;
        if (free_entp->next < &sp->dec_codetab[0] ||
            free_entp->next >= &sp->dec_codetab[CSIZE])
        {
            TIFFErrorExtR(tif, module,
                          "Corrupted LZW table at scanline %" PRIu32,
                          tif->tif_row);
            return (0);
        }
        free_entp->firstchar = free_entp->next->firstchar;
        free_entp->length = free_entp->next->length + 1;
        free_entp->value =
            (codep < free_entp) ? codep->firstchar : free_entp->firstchar;
        if (++free_entp > maxcodep)
        {
            if (++nbits > BITS_MAX) /* should not happen */
                nbits = BITS_MAX;
            nbitsmask = MAXCODE(nbits);
            maxcodep = sp->dec_codetab + nbitsmask;
        }
        oldcodep = codep;
        if (code >= 256)
        {
            /*
             * Code maps to a string, copy string
             * value to output (written in reverse).
             */
            if (codep->length == 0)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Wrong length of decoded "
                    "string: data probably corrupted at scanline %" PRIu32,
                    tif->tif_row);
                return (0);
            }
            if (codep->length > occ)
            {
                /*
                 * String is too long for decode buffer,
                 * locate portion that will fit, copy to
                 * the decode buffer, and setup restart
                 * logic for the next decoding call.
                 */
                sp->dec_codep = codep;
                do
                {
                    codep = codep->next;
                } while (codep->length > occ);
                sp->dec_restart = occ;
                tp = op + occ;
                do
                {
                    *--tp = codep->value;
                    codep = codep->next;
                } while (--occ);
                break;
            }
            len = codep->length;
            tp = op + len;
            do
            {
                *--tp = codep->value;
                codep = codep->next;
            } while (codep && tp > op);
            assert(occ >= len);
            op += len;
            occ -= len;
        }
        else
        {
            *op++ = (uint8_t)code;
            occ--;
        }
    }

    tif->tif_rawcc -= (tmsize_t)((uint8_t *)bp - tif->tif_rawcp);
    tif->tif_rawcp = (uint8_t *)bp;

    sp->old_tif_rawcc = tif->tif_rawcc;
    sp->dec_bitsleft = dec_bitsleft;

    sp->lzw_nbits = (unsigned short)nbits;
    sp->lzw_nextdata = nextdata;
    sp->lzw_nextbits = nextbits;
    sp->dec_nbitsmask = nbitsmask;
    sp->dec_oldcodep = oldcodep;
    sp->dec_free_entp = free_entp;
    sp->dec_maxcodep = maxcodep;

    if (occ > 0)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at scanline %" PRIu32 " (short %" PRIu64
                      " bytes)",
                      tif->tif_row, (uint64_t)occ);
        return (0);
    }
    return (1);
}